

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall testing::ExpectationSet::ExpectationSet(ExpectationSet *this,Expectation *e)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->expectations_)._M_t._M_impl.super__Rb_tree_header;
  (this->expectations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->expectations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->expectations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->expectations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->expectations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
  ::_M_insert_unique<testing::Expectation_const&>
            ((_Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
              *)this,e);
  return;
}

Assistant:

ExpectationSet(const Expectation& e) {  // NOLINT
    *this += e;
  }